

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

bool __thiscall psy::C::TypeChecker::isAssignable(TypeChecker *this,SyntaxNode *node,Type *ty)

{
  Type *node_00;
  TypeKind TVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Type *ty_00;
  undefined4 extraout_var_00;
  TagDeclarationSymbol *this_00;
  reference ppMVar4;
  undefined4 extraout_var_01;
  Type *membTy;
  MemberDeclarationSymbol **membDecl;
  __normal_iterator<const_psy::C::MemberDeclarationSymbol_**,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
  local_e8;
  iterator __end2;
  iterator __begin2;
  Members *__range2;
  TagDeclarationSymbol *tagTyDecl;
  TagType *tagTy;
  SyntaxToken local_60;
  Type *local_28;
  Type *ty_local;
  SyntaxNode *node_local;
  TypeChecker *this_local;
  
  local_28 = ty;
  ty_local = (Type *)node;
  node_local = (SyntaxNode *)this;
  TVar1 = Type::kind(ty);
  node_00 = ty_local;
  switch(TVar1) {
  case Array:
    C::SyntaxNode::lastToken((SyntaxToken *)&tagTy,(SyntaxNode *)ty_local);
    DiagnosticsReporter::CannotAssignToExpressionOfArrayType
              (&this->diagReporter_,(SyntaxToken *)&tagTy);
    SyntaxToken::~SyntaxToken((SyntaxToken *)&tagTy);
    this_local._7_1_ = 0;
    break;
  default:
    this_local._7_1_ = 1;
    break;
  case TypedefName:
    iVar3 = (*local_28->_vptr_Type[0xb])();
    ty_00 = TypedefNameType::resolvedSynonymizedType
                      ((TypedefNameType *)CONCAT44(extraout_var,iVar3));
    this_local._7_1_ = isAssignable(this,(SyntaxNode *)node_00,ty_00);
    break;
  case Tag:
    iVar3 = (*local_28->_vptr_Type[0xd])();
    this_00 = TagType::declaration((TagType *)CONCAT44(extraout_var_00,iVar3));
    if (this_00 == (TagDeclarationSymbol *)0x0) {
      this_local._7_1_ = 0;
    }
    else {
      TagDeclarationSymbol::members((Members *)&__begin2,this_00);
      __end2 = std::
               vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
               ::begin((vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                        *)&__begin2);
      local_e8._M_current =
           (MemberDeclarationSymbol **)
           std::
           vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
           ::end((vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                  *)&__begin2);
      while (bVar2 = __gnu_cxx::operator!=(&__end2,&local_e8), bVar2) {
        ppMVar4 = __gnu_cxx::
                  __normal_iterator<const_psy::C::MemberDeclarationSymbol_**,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
                  ::operator*(&__end2);
        iVar3 = (*((*ppMVar4)->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x26])();
        bVar2 = isAssignable(this,(SyntaxNode *)ty_local,(Type *)CONCAT44(extraout_var_01,iVar3));
        if (!bVar2) {
          this_local._7_1_ = 0;
          membDecl._4_4_ = 1;
          goto LAB_00460f44;
        }
        __gnu_cxx::
        __normal_iterator<const_psy::C::MemberDeclarationSymbol_**,_std::vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>_>
        ::operator++(&__end2);
      }
      membDecl._4_4_ = 3;
LAB_00460f44:
      std::
      vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
      ::~vector((vector<const_psy::C::MemberDeclarationSymbol_*,_std::allocator<const_psy::C::MemberDeclarationSymbol_*>_>
                 *)&__begin2);
      if (membDecl._4_4_ != 1) {
        this_local._7_1_ = 1;
      }
    }
    break;
  case Qualified:
    C::SyntaxNode::lastToken(&local_60,(SyntaxNode *)ty_local);
    DiagnosticsReporter::CannotAssignToExpressionOfConstQualifiedType
              (&this->diagReporter_,&local_60);
    SyntaxToken::~SyntaxToken(&local_60);
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TypeChecker::isAssignable(const SyntaxNode* node, const Type* ty)
{
    switch (ty->kind()) {
        case TypeKind::Qualified:
            diagReporter_.CannotAssignToExpressionOfConstQualifiedType(node->lastToken());
            return false;
        case TypeKind::TypedefName:
            return isAssignable(node, ty->asTypedefNameType()->resolvedSynonymizedType());
        case TypeKind::Array:
            diagReporter_.CannotAssignToExpressionOfArrayType(node->lastToken());
            return false;
        case TypeKind::Tag: {
            auto tagTy = ty->asTagType();
            auto tagTyDecl = tagTy->declaration();
            if (!tagTyDecl)
                return false;
            for (const auto& membDecl : tagTyDecl->members()) {
                auto membTy = membDecl->type();
                if (!isAssignable(node, membTy))
                    return false;
            }
            return true;
        }
        default:
            return true;
    }
}